

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O0

int testGetFullTerritoryName(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  size_t sVar64;
  char *pcVar65;
  char *pcVar66;
  char local_5b0 [8];
  char s_2 [8];
  char territoryNameLocal [112];
  char local_52c [8];
  char s_1 [8];
  char s [8];
  int len;
  char expectedLocalName [112];
  int nrInLocale;
  char *locale;
  char territoryName [1135];
  TerritoryAlphabets *territoryAlphabets;
  int i;
  int alternative;
  int maxLength;
  int nrNames;
  Territory territory;
  int nrTests;
  
  alternative = 0;
  i = 0;
  iVar1 = testGetFullTerritoryNameInLocale("Sancta Sedes",TERRITORY_VAT,0,(char *)0x0);
  iVar2 = testGetFullTerritoryNameInLocale(anon_var_dwarf_4b1 + 9,TERRITORY_VAT,0,"");
  iVar3 = testGetFullTerritoryNameInLocale(anon_var_dwarf_4b1 + 9,TERRITORY_VAT,0,"E");
  iVar4 = testGetFullTerritoryNameInLocale(anon_var_dwarf_4b1 + 9,TERRITORY_VAT,0,"EN");
  iVar5 = testGetFullTerritoryNameInLocale(anon_var_dwarf_4b1 + 9,TERRITORY_VAT,0,"??");
  iVar6 = testGetFullTerritoryNameInLocale(anon_var_dwarf_4b1 + 9,TERRITORY_VAT,0,"-");
  iVar7 = testGetFullTerritoryNameInLocale(anon_var_dwarf_4b1 + 9,TERRITORY_VAT,0,"_");
  iVar8 = testGetFullTerritoryNameInLocale(anon_var_dwarf_4b1 + 9,TERRITORY_VAT,0,"_EN");
  nrNames = iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
  for (territoryAlphabets._0_4_ = 0; (int)(uint)territoryAlphabets < 0x1b;
      territoryAlphabets._0_4_ = (uint)territoryAlphabets + 1) {
    pcVar66 = testGetFullTerritoryName::locales_to_test[(int)(uint)territoryAlphabets];
    for (maxLength = 0x3e9; maxLength < 0x5fe; maxLength = maxLength + 1) {
      getFullTerritoryNameInLocaleUtf8(s + 4,maxLength,0,(char *)0x0);
      iVar1 = testGetFullTerritoryNameInLocale(s + 4,maxLength,0,(char *)0x0);
      iVar2 = testGetFullTerritoryNameInLocale("",maxLength,-1,pcVar66);
      iVar3 = testGetFullTerritoryNameInLocale("",maxLength,999,pcVar66);
      nrNames = iVar3 + iVar2 + iVar1 + nrNames;
      territoryAlphabets._4_4_ = 0;
      while( true ) {
        iVar1 = getFullTerritoryNameInLocaleUtf8
                          ((char *)&locale,maxLength,territoryAlphabets._4_4_,pcVar66);
        if (iVar1 == 0) break;
        alternative = alternative + 1;
        sVar64 = strlen((char *)&locale);
        s._0_4_ = (undefined4)sVar64;
        nrNames = nrNames + 1;
        if (((int)s._0_4_ < 1) || (0x6f < (int)s._0_4_)) {
          foundError();
          pcVar65 = getTerritoryIsoName(s_1,maxLength,0);
          printf("*** ERROR *** Bad %s territoryname %s, %d characters (limit is %d): %s\n",pcVar66,
                 pcVar65,(ulong)(uint)s._0_4_,0x6f,&locale);
        }
        if (i < (int)s._0_4_) {
          i._0_1_ = s[0];
          i._1_1_ = s[1];
          i._2_1_ = s[2];
          i._3_1_ = s[3];
        }
        territoryAlphabets._4_4_ = territoryAlphabets._4_4_ + 1;
      }
    }
  }
  maxLength = 0x3e9;
  do {
    if (0x5fd < maxLength) {
      printf("%d territory names, max length %d characters\n",(ulong)(uint)alternative,
             (ulong)(uint)i);
      iVar1 = testGetFullTerritoryNameInLocale("Netherlands",TERRITORY_NLD,0,"en_US");
      iVar2 = testGetFullTerritoryNameInLocale("The Netherlands",TERRITORY_NLD,1,"en_US");
      iVar3 = testGetFullTerritoryNameInLocale("",TERRITORY_NLD,2,"en_US");
      iVar4 = testGetFullTerritoryNameInLocale("Russia",TERRITORY_RUS,0,"en_US");
      iVar5 = testGetFullTerritoryNameInLocale("Russian Federation",TERRITORY_RUS,1,"en_US");
      iVar6 = testGetFullTerritoryNameInLocale("",TERRITORY_RUS,2,"en_US");
      iVar7 = testGetFullTerritoryNameInLocale(anon_var_dwarf_3a28c + 0x1d,TERRITORY_KAZ,0,"en_US");
      iVar8 = testGetFullTerritoryNameInLocale("",TERRITORY_KAZ,1,"en_US");
      iVar9 = testGetFullTerritoryNameInLocale("Turkmenistan",TERRITORY_TKM,0,"en_US");
      iVar10 = testGetFullTerritoryNameInLocale("",TERRITORY_TKM,1,"en_US");
      iVar11 = testGetFullTerritoryNameInLocale("",TERRITORY_TKM,2,"en_US");
      iVar12 = testGetFullTerritoryNameInLocale("",TERRITORY_TKM,999,"en_US");
      iVar13 = testGetFullTerritoryNameInLocale("Nederland",TERRITORY_NLD,0,"nl");
      iVar14 = testGetFullTerritoryNameInLocale("",TERRITORY_NLD,1,"nl");
      iVar15 = testGetFullTerritoryNameInLocale("Vaticaanstad",TERRITORY_VAT,0,"nl");
      iVar16 = testGetFullTerritoryNameInLocale("Heilige Stoel",TERRITORY_VAT,1,"nl");
      iVar17 = testGetFullTerritoryNameInLocale("",TERRITORY_VAT,2,"nl");
      iVar18 = testGetFullTerritoryNameInLocale("",TERRITORY_VAT,3,"nl");
      iVar19 = testGetFullTerritoryNameInLocale("Pays-Bas",TERRITORY_NLD,0,"fr");
      iVar20 = testGetFullTerritoryNameInLocale("",TERRITORY_NLD,1,"fr");
      iVar21 = testGetFullTerritoryNameInLocale(anon_var_dwarf_4b1 + 9,TERRITORY_VAT,0,"fr");
      iVar22 = testGetFullTerritoryNameInLocale(anon_var_dwarf_4b1,TERRITORY_VAT,1,"fr");
      iVar23 = testGetFullTerritoryNameInLocale(anon_var_dwarf_439e3 + 0x19,TERRITORY_VAT,2,"fr");
      iVar24 = testGetFullTerritoryNameInLocale("",TERRITORY_VAT,3,"fr");
      iVar25 = testGetFullTerritoryNameLocal("Nederland",TERRITORY_NLD,0);
      iVar26 = testGetFullTerritoryNameLocal("",TERRITORY_NLD,1);
      iVar27 = testGetFullTerritoryNameLocalInAlphabet("Nederland",TERRITORY_NLD,0,ALPHABET_ROMAN);
      iVar28 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,1,ALPHABET_ROMAN);
      iVar29 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,0,ALPHABET_GREEK);
      iVar30 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,0,_ALPHABET_MIN);
      iVar31 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_NLD,0,_ALPHABET_MAX);
      iVar32 = testGetFullTerritoryNameLocal(anon_var_dwarf_4d3,TERRITORY_RUS,0);
      iVar33 = testGetFullTerritoryNameLocal("",TERRITORY_RUS,1);
      iVar34 = testGetFullTerritoryNameLocalInAlphabet
                         (anon_var_dwarf_4d3,TERRITORY_RUS,0,ALPHABET_CYRILLIC);
      iVar35 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,ALPHABET_ROMAN);
      iVar36 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,ALPHABET_GREEK);
      iVar37 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,_ALPHABET_MIN);
      iVar38 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_RUS,0,_ALPHABET_MAX);
      iVar39 = testGetFullTerritoryNameLocal(anon_var_dwarf_4ea,TERRITORY_KAZ,0);
      iVar40 = testGetFullTerritoryNameLocal("Qazaqstan",TERRITORY_KAZ,1);
      iVar41 = testGetFullTerritoryNameLocal(anon_var_dwarf_3a28c + 0x1d,TERRITORY_KAZ,2);
      iVar42 = testGetFullTerritoryNameLocal("",TERRITORY_KAZ,3);
      iVar43 = testGetFullTerritoryNameLocalInAlphabet
                         (anon_var_dwarf_4ea,TERRITORY_KAZ,0,ALPHABET_CYRILLIC);
      iVar44 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,1,ALPHABET_CYRILLIC);
      iVar45 = testGetFullTerritoryNameLocalInAlphabet("Qazaqstan",TERRITORY_KAZ,0,ALPHABET_ROMAN);
      iVar46 = testGetFullTerritoryNameLocalInAlphabet
                         (anon_var_dwarf_3a28c + 0x1d,TERRITORY_KAZ,1,ALPHABET_ROMAN);
      iVar47 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,2,ALPHABET_ROMAN);
      iVar48 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,ALPHABET_GREEK);
      iVar49 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MIN);
      iVar50 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MAX);
      iVar51 = testGetFullTerritoryNameLocal(anon_var_dwarf_500,TERRITORY_TKM,0);
      iVar52 = testGetFullTerritoryNameLocal(anon_var_dwarf_517,TERRITORY_TKM,1);
      iVar53 = testGetFullTerritoryNameLocal(anon_var_dwarf_39ece + 0x27,TERRITORY_TKM,2);
      iVar54 = testGetFullTerritoryNameLocal("",TERRITORY_TKM,3);
      iVar55 = testGetFullTerritoryNameLocalInAlphabet
                         (anon_var_dwarf_517,TERRITORY_TKM,0,ALPHABET_ROMAN);
      iVar56 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_TKM,1,ALPHABET_ROMAN);
      iVar57 = testGetFullTerritoryNameLocalInAlphabet
                         (anon_var_dwarf_500,TERRITORY_TKM,0,ALPHABET_CYRILLIC);
      iVar58 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_TKM,1,ALPHABET_CYRILLIC);
      iVar59 = testGetFullTerritoryNameLocalInAlphabet
                         (anon_var_dwarf_39ece + 0x27,TERRITORY_TKM,0,ALPHABET_ARABIC);
      iVar60 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_TKM,1,ALPHABET_ARABIC);
      iVar61 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,ALPHABET_GREEK);
      iVar62 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MIN);
      iVar63 = testGetFullTerritoryNameLocalInAlphabet("",TERRITORY_KAZ,0,_ALPHABET_MAX);
      return iVar63 + iVar62 + iVar61 + iVar60 + iVar59 + iVar58 + iVar57 + iVar56 + iVar55 + iVar54
                                                                                              + 
                                                  iVar53 + iVar52 + iVar51 + iVar50 + iVar49 + 
                                                  iVar48 + iVar47 + iVar46 + iVar45 + iVar44 + 
                                                  iVar43 + iVar42 + iVar41 + iVar40 + iVar39 + 
                                                  iVar38 + iVar37 + iVar36 + iVar35 + iVar34 + 
                                                  iVar33 + iVar32 + iVar31 + iVar30 + iVar29 + 
                                                  iVar28 + iVar27 + iVar26 + iVar25 + iVar24 + 
                                                  iVar23 + iVar22 + iVar21 + iVar20 + iVar19 + 
                                                  iVar18 + iVar17 + iVar16 + iVar15 + iVar14 + 
                                                  iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 
                                                  + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + 
                                                  iVar1 + nrNames;
    }
    register0x00000000 = getAlphabetsForTerritory(maxLength);
    for (territoryAlphabets._0_4_ = 0;
        (int)(uint)territoryAlphabets < stack0xffffffffffffffd8->count;
        territoryAlphabets._0_4_ = (uint)territoryAlphabets + 1) {
      nrNames = nrNames + 1;
      iVar1 = getFullTerritoryNameLocalInAlphabetUtf8
                        ((char *)&locale,maxLength,0,
                         stack0xffffffffffffffd8->alphabet[(int)(uint)territoryAlphabets]);
      if (iVar1 == 0) {
        foundError();
        pcVar66 = getTerritoryIsoName(local_52c,maxLength,0);
        printf("*** ERROR *** getFullTerritoryNameLocal territory %s has NO name in common alphabet (%d)\n"
               ,pcVar66,(ulong)(uint)stack0xffffffffffffffd8->alphabet[0]);
      }
    }
    nrNames = nrNames + 1;
    register0x00000000 = getAlphabetsForTerritory(maxLength);
    for (territoryAlphabets._0_4_ = 0;
        (int)(uint)territoryAlphabets < stack0xffffffffffffffd8->count;
        territoryAlphabets._0_4_ = (uint)territoryAlphabets + 1) {
      iVar1 = getFullTerritoryNameLocalInAlphabetUtf8
                        ((char *)&locale,maxLength,0,
                         stack0xffffffffffffffd8->alphabet[(int)(uint)territoryAlphabets]);
      if (iVar1 == 0) {
        foundError();
        pcVar66 = getTerritoryIsoName(local_5b0,maxLength,0);
        printf("*** ERROR *** getFullTerritoryNameLocal Territory %s has NO name in common alphabet %d\n"
               ,pcVar66,(ulong)(uint)stack0xffffffffffffffd8->alphabet
                                     [(int)(uint)territoryAlphabets]);
      }
      iVar1 = getFullTerritoryNameLocalUtf8(s_2,maxLength,(uint)territoryAlphabets);
      if (iVar1 == 0) {
LAB_001cc70d:
        foundError();
        printf("*** ERROR *** getFullTerritoryNameLocal Territory name %s (%d) does not match local name %s\n"
               ,&locale,(ulong)(uint)territoryAlphabets,s_2);
      }
      else {
        iVar1 = strcmp((char *)&locale,s_2);
        if (iVar1 != 0) goto LAB_001cc70d;
      }
    }
    maxLength = maxLength + 1;
  } while( true );
}

Assistant:

int testGetFullTerritoryName(void) {
    int nrTests = 0;
    enum Territory territory;
    int nrNames = 0;
    int maxLength = 0;
    int alternative;
    int i;
    const TerritoryAlphabets *territoryAlphabets;
    char territoryName[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1024]; // large so we can test overflow
    static const char *locales_to_test[] = {
            "AF", "AR", "BE", "CN", "CS", "DA", "DE", "EN", "FI", "ES", "FR", "HE", "HI",
            "HR", "ID", "IT", "JA", "KO", "NL", "NO", "PL", "PT", "RU", "SV", "SW", "TR", "UK"};

    nrTests += testGetFullTerritoryNameInLocale("Sancta Sedes", TERRITORY_VAT, 0, NULL);    // Local name.
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "");           // Wrong locale -> fallback language.
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "E");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "EN");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "??");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "-");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "_");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "_EN");

    for (i = 0; i < (int) (sizeof(locales_to_test) / sizeof(locales_to_test[0])); i++) {
        const char *locale = locales_to_test[i];
        int nrInLocale = 0;
        for (territory = _TERRITORY_MIN + 1; territory < _TERRITORY_MAX; ++territory) {
            char expectedLocalName[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1];
            getFullTerritoryNameInLocaleUtf8(expectedLocalName, territory, 0, 0);

            nrTests += testGetFullTerritoryNameInLocale(expectedLocalName, territory, 0, NULL);
            nrTests += testGetFullTerritoryNameInLocale("", territory, -1, locale);
            nrTests += testGetFullTerritoryNameInLocale("", territory, 999, locale);
            for (alternative = 0;; alternative++) {
                int len;
                if (!getFullTerritoryNameInLocaleUtf8(territoryName, territory, alternative, locale)) {
                    break;
                }
                ++nrInLocale;
                ++nrNames;
                len = (int) strlen(territoryName);
                nrTests++;
                if (len < 1 || len > MAX_TERRITORY_FULLNAME_UTF8_LEN) {
                    char s[MAX_ISOCODE_ASCII_LEN + 1];
                    foundError();
                    printf("*** ERROR *** Bad %s territoryname %s, %d characters (limit is %d): %s\n",
                           locale, getTerritoryIsoName(s, territory, 0), len,
                           MAX_TERRITORY_FULLNAME_UTF8_LEN, territoryName);
                }
                if (len > maxLength) {
                    maxLength = len;
                }
            }
        }
    }

    // check that every territory has a local name in all the common alphabets
    for (territory = _TERRITORY_MIN + 1; territory < _TERRITORY_MAX; ++territory) {
        territoryAlphabets = getAlphabetsForTerritory(territory);
        for (i = 0; i < territoryAlphabets->count; i++) {
            nrTests++;
            if (!getFullTerritoryNameLocalInAlphabetUtf8(territoryName, territory, 0,
                                                         territoryAlphabets->alphabet[i])) {
                char s[MAX_ISOCODE_ASCII_LEN + 1];
                foundError();
                printf("*** ERROR *** getFullTerritoryNameLocal territory %s has NO name in common alphabet (%d)\n",
                       getTerritoryIsoName(s, territory, 0), territoryAlphabets->alphabet[0]);
            }
        }

        // check that the x-th local name is in the x-th common alphabet
        nrTests++;
        territoryAlphabets = getAlphabetsForTerritory(territory);
        for (i = 0; i < territoryAlphabets->count; i++) {
            char territoryNameLocal[MAX_TERRITORY_FULLNAME_UTF8_LEN + 1];
            if (!getFullTerritoryNameLocalInAlphabetUtf8(territoryName, territory, 0, territoryAlphabets->alphabet[i])) {
                char s[MAX_ISOCODE_ASCII_LEN + 1];
                foundError();
                printf("*** ERROR *** getFullTerritoryNameLocal Territory %s has NO name in common alphabet %d\n",
                       getTerritoryIsoName(s, territory, 0), territoryAlphabets->alphabet[i]);
            }
            if (!getFullTerritoryNameLocalUtf8(territoryNameLocal, territory, i) ||
                strcmp(territoryName, territoryNameLocal)) {
                foundError();
                printf("*** ERROR *** getFullTerritoryNameLocal Territory name %s (%d) does not match local name %s\n",
                       territoryName, i, territoryNameLocal);
            }
        }
    }
    printf("%d territory names, max length %d characters\n", nrNames, maxLength);

    nrTests += testGetFullTerritoryNameInLocale("Netherlands", TERRITORY_NLD, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("The Netherlands", TERRITORY_NLD, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_NLD, 2, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Russia", TERRITORY_RUS, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Russian Federation", TERRITORY_RUS, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_RUS, 2, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Kazakhstan", TERRITORY_KAZ, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_KAZ, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("Turkmenistan", TERRITORY_TKM, 0, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_TKM, 1, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_TKM, 2, "en_US");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_TKM, 999, "en_US");

#ifdef MAPCODE_SUPPORT_LANGUAGE_NL
    nrTests += testGetFullTerritoryNameInLocale("Nederland", TERRITORY_NLD, 0, "nl");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_NLD, 1, "nl");
    nrTests += testGetFullTerritoryNameInLocale("Vaticaanstad", TERRITORY_VAT, 0, "nl");
    nrTests += testGetFullTerritoryNameInLocale("Heilige Stoel", TERRITORY_VAT, 1, "nl");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_VAT, 2, "nl");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_VAT, 3, "nl");
#else
    nrTests += testGetFullTerritoryNameInLocale("Netherlands", TERRITORY_NLD, 0, "nl");
#endif

#ifdef MAPCODE_SUPPORT_LANGUAGE_FR
    nrTests += testGetFullTerritoryNameInLocale("Pays-Bas", TERRITORY_NLD, 0, "fr");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_NLD, 1, "fr");
    nrTests += testGetFullTerritoryNameInLocale("Vatican", TERRITORY_VAT, 0, "fr");
    nrTests += testGetFullTerritoryNameInLocale("Cit\xC3\xA9 du Vatican", TERRITORY_VAT, 1, "fr");
    nrTests += testGetFullTerritoryNameInLocale("Saint-Si\xC3\xA8ge", TERRITORY_VAT, 2, "fr");
    nrTests += testGetFullTerritoryNameInLocale("", TERRITORY_VAT, 3, "fr");
#else
    nrTests += testGetFullTerritoryNameInLocale("Netherlands", TERRITORY_NLD, 0, "fr");
#endif

    nrTests += testGetFullTerritoryNameLocal("Nederland", TERRITORY_NLD, 0);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_NLD, 1);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Nederland", TERRITORY_NLD, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 1, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_NLD, 0, _ALPHABET_MAX);
    nrTests += testGetFullTerritoryNameLocal("Росси́я", TERRITORY_RUS, 0);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_RUS, 1);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Росси́я", TERRITORY_RUS, 0, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_RUS, 0, _ALPHABET_MAX);
    nrTests += testGetFullTerritoryNameLocal("Қазақстан", TERRITORY_KAZ, 0);
    nrTests += testGetFullTerritoryNameLocal("Qazaqstan", TERRITORY_KAZ, 1);
    nrTests += testGetFullTerritoryNameLocal("Kazakhstan", TERRITORY_KAZ, 2);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_KAZ, 3);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Қазақстан", TERRITORY_KAZ, 0, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 1, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Qazaqstan", TERRITORY_KAZ, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Kazakhstan", TERRITORY_KAZ, 1, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 2, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MAX);
    nrTests += testGetFullTerritoryNameLocal("Түркменистан", TERRITORY_TKM, 0);
    nrTests += testGetFullTerritoryNameLocal("Türkmenistan", TERRITORY_TKM, 1);
    nrTests += testGetFullTerritoryNameLocal("تۆركمنيستآن", TERRITORY_TKM, 2);
    nrTests += testGetFullTerritoryNameLocal("", TERRITORY_TKM, 3);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Türkmenistan", TERRITORY_TKM, 0, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_TKM, 1, ALPHABET_ROMAN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("Түркменистан", TERRITORY_TKM, 0, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_TKM, 1, ALPHABET_CYRILLIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("تۆركمنيستآن", TERRITORY_TKM, 0, ALPHABET_ARABIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_TKM, 1, ALPHABET_ARABIC);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, ALPHABET_GREEK);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MIN);
    nrTests += testGetFullTerritoryNameLocalInAlphabet("", TERRITORY_KAZ, 0, _ALPHABET_MAX);

    return nrTests;
}